

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_keypair_create(secp256k1_context *ctx,secp256k1_keypair *keypair,uchar *seckey32)

{
  uint uVar1;
  void *pvVar2;
  char *pcVar3;
  secp256k1_scalar sk;
  secp256k1_ge pk;
  
  if (ctx == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modules/extrakeys/main_impl.h"
            ,200,"test condition failed: ctx != NULL");
    abort();
  }
  if (keypair == (secp256k1_keypair *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "keypair != NULL";
  }
  else {
    keypair->data[0x50] = '\0';
    keypair->data[0x51] = '\0';
    keypair->data[0x52] = '\0';
    keypair->data[0x53] = '\0';
    keypair->data[0x54] = '\0';
    keypair->data[0x55] = '\0';
    keypair->data[0x56] = '\0';
    keypair->data[0x57] = '\0';
    keypair->data[0x58] = '\0';
    keypair->data[0x59] = '\0';
    keypair->data[0x5a] = '\0';
    keypair->data[0x5b] = '\0';
    keypair->data[0x5c] = '\0';
    keypair->data[0x5d] = '\0';
    keypair->data[0x5e] = '\0';
    keypair->data[0x5f] = '\0';
    keypair->data[0x40] = '\0';
    keypair->data[0x41] = '\0';
    keypair->data[0x42] = '\0';
    keypair->data[0x43] = '\0';
    keypair->data[0x44] = '\0';
    keypair->data[0x45] = '\0';
    keypair->data[0x46] = '\0';
    keypair->data[0x47] = '\0';
    keypair->data[0x48] = '\0';
    keypair->data[0x49] = '\0';
    keypair->data[0x4a] = '\0';
    keypair->data[0x4b] = '\0';
    keypair->data[0x4c] = '\0';
    keypair->data[0x4d] = '\0';
    keypair->data[0x4e] = '\0';
    keypair->data[0x4f] = '\0';
    keypair->data[0x30] = '\0';
    keypair->data[0x31] = '\0';
    keypair->data[0x32] = '\0';
    keypair->data[0x33] = '\0';
    keypair->data[0x34] = '\0';
    keypair->data[0x35] = '\0';
    keypair->data[0x36] = '\0';
    keypair->data[0x37] = '\0';
    keypair->data[0x38] = '\0';
    keypair->data[0x39] = '\0';
    keypair->data[0x3a] = '\0';
    keypair->data[0x3b] = '\0';
    keypair->data[0x3c] = '\0';
    keypair->data[0x3d] = '\0';
    keypair->data[0x3e] = '\0';
    keypair->data[0x3f] = '\0';
    keypair->data[0x20] = '\0';
    keypair->data[0x21] = '\0';
    keypair->data[0x22] = '\0';
    keypair->data[0x23] = '\0';
    keypair->data[0x24] = '\0';
    keypair->data[0x25] = '\0';
    keypair->data[0x26] = '\0';
    keypair->data[0x27] = '\0';
    keypair->data[0x28] = '\0';
    keypair->data[0x29] = '\0';
    keypair->data[0x2a] = '\0';
    keypair->data[0x2b] = '\0';
    keypair->data[0x2c] = '\0';
    keypair->data[0x2d] = '\0';
    keypair->data[0x2e] = '\0';
    keypair->data[0x2f] = '\0';
    keypair->data[0x10] = '\0';
    keypair->data[0x11] = '\0';
    keypair->data[0x12] = '\0';
    keypair->data[0x13] = '\0';
    keypair->data[0x14] = '\0';
    keypair->data[0x15] = '\0';
    keypair->data[0x16] = '\0';
    keypair->data[0x17] = '\0';
    keypair->data[0x18] = '\0';
    keypair->data[0x19] = '\0';
    keypair->data[0x1a] = '\0';
    keypair->data[0x1b] = '\0';
    keypair->data[0x1c] = '\0';
    keypair->data[0x1d] = '\0';
    keypair->data[0x1e] = '\0';
    keypair->data[0x1f] = '\0';
    keypair->data[0] = '\0';
    keypair->data[1] = '\0';
    keypair->data[2] = '\0';
    keypair->data[3] = '\0';
    keypair->data[4] = '\0';
    keypair->data[5] = '\0';
    keypair->data[6] = '\0';
    keypair->data[7] = '\0';
    keypair->data[8] = '\0';
    keypair->data[9] = '\0';
    keypair->data[10] = '\0';
    keypair->data[0xb] = '\0';
    keypair->data[0xc] = '\0';
    keypair->data[0xd] = '\0';
    keypair->data[0xe] = '\0';
    keypair->data[0xf] = '\0';
    if ((ctx->ecmult_gen_ctx).built == 0) {
      pvVar2 = (ctx->illegal_callback).data;
      pcVar3 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
    }
    else {
      if (seckey32 != (uchar *)0x0) {
        uVar1 = secp256k1_ec_pubkey_create_helper(&ctx->ecmult_gen_ctx,&sk,&pk,seckey32);
        secp256k1_keypair_save(keypair,&sk,&pk);
        secp256k1_memczero(keypair,0x60,uVar1 ^ 1);
        secp256k1_scalar_clear(&sk);
        return uVar1;
      }
      pvVar2 = (ctx->illegal_callback).data;
      pcVar3 = "seckey32 != NULL";
    }
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_keypair_create(const secp256k1_context* ctx, secp256k1_keypair *keypair, const unsigned char *seckey32) {
    secp256k1_scalar sk;
    secp256k1_ge pk;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(keypair != NULL);
    memset(keypair, 0, sizeof(*keypair));
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(seckey32 != NULL);

    ret = secp256k1_ec_pubkey_create_helper(&ctx->ecmult_gen_ctx, &sk, &pk, seckey32);
    secp256k1_keypair_save(keypair, &sk, &pk);
    secp256k1_memczero(keypair, sizeof(*keypair), !ret);

    secp256k1_scalar_clear(&sk);
    return ret;
}